

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O2

int64_t highbd_get_sse(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  int iVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  ulong uVar5;
  int w;
  ulong uVar6;
  int h;
  long lVar7;
  
  iVar1 = (int)((long)width / 0x10);
  w = width + iVar1 * -0x10;
  iVar2 = height / 0x10;
  h = height % 0x10;
  if (w < 1) {
    iVar3 = 0;
  }
  else {
    iVar3 = encoder_highbd_sse(a + (width - w),a_stride,b + (width - w),b_stride,w,height);
  }
  if (0 < h) {
    iVar4 = encoder_highbd_sse(a + (height - h) * a_stride,a_stride,b + (height - h) * b_stride,
                               b_stride,width - w,h);
    iVar3 = iVar3 + iVar4;
  }
  uVar5 = 0;
  uVar6 = (long)width / 0x10 & 0xffffffff;
  if (iVar1 < 1) {
    uVar6 = uVar5;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (; (int)uVar5 != iVar2; uVar5 = (ulong)((int)uVar5 + 1)) {
    for (lVar7 = 0; (int)(uVar6 << 4) != (int)lVar7; lVar7 = lVar7 + 0x10) {
      iVar4 = (*aom_highbd_sse)(a + lVar7,a_stride,b + lVar7,b_stride,0x10,0x10);
      iVar3 = iVar3 + iVar4;
    }
    a = a + (a_stride << 4);
    b = b + (b_stride << 4);
  }
  return iVar3;
}

Assistant:

static int64_t highbd_get_sse(const uint8_t *a, int a_stride, const uint8_t *b,
                              int b_stride, int width, int height) {
  int64_t total_sse = 0;
  int x, y;
  const int dw = width % 16;
  const int dh = height % 16;

  if (dw > 0) {
    total_sse += encoder_highbd_sse(&a[width - dw], a_stride, &b[width - dw],
                                    b_stride, dw, height);
  }
  if (dh > 0) {
    total_sse += encoder_highbd_sse(&a[(height - dh) * a_stride], a_stride,
                                    &b[(height - dh) * b_stride], b_stride,
                                    width - dw, dh);
  }

  for (y = 0; y < height / 16; ++y) {
    const uint8_t *pa = a;
    const uint8_t *pb = b;
    for (x = 0; x < width / 16; ++x) {
      total_sse += aom_highbd_sse(pa, a_stride, pb, b_stride, 16, 16);
      pa += 16;
      pb += 16;
    }
    a += 16 * a_stride;
    b += 16 * b_stride;
  }
  return total_sse;
}